

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGPopErrors(xmlRelaxNGValidCtxtPtr ctxt,int level)

{
  xmlRelaxNGValidErrorPtr pxVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = ctxt->errNr;
  if (level < iVar3) {
    lVar4 = (long)level;
    lVar5 = lVar4 * 0x28 + 0x20;
    do {
      pxVar1 = ctxt->errTab;
      if ((*(byte *)((long)pxVar1 + lVar5 + -0x1c) & 1) != 0) {
        pvVar2 = *(void **)((long)pxVar1 + lVar5 + -8);
        if (pvVar2 != (void *)0x0) {
          (*xmlFree)(pvVar2);
        }
        *(undefined8 *)((long)pxVar1 + lVar5 + -8) = 0;
        pvVar2 = *(void **)((long)&pxVar1->err + lVar5);
        if (pvVar2 != (void *)0x0) {
          (*xmlFree)(pvVar2);
        }
        *(undefined8 *)((long)&pxVar1->err + lVar5) = 0;
        *(undefined4 *)((long)pxVar1 + lVar5 + -0x1c) = 0;
        iVar3 = ctxt->errNr;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar4 < iVar3);
  }
  ctxt->errNr = level;
  if (level < 1) {
    ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  }
  return;
}

Assistant:

static void
xmlRelaxNGPopErrors(xmlRelaxNGValidCtxtPtr ctxt, int level)
{
    int i;
    xmlRelaxNGValidErrorPtr err;

#ifdef DEBUG_ERROR
    xmlGenericError(xmlGenericErrorContext,
                    "Pop errors till level %d\n", level);
#endif
    for (i = level; i < ctxt->errNr; i++) {
        err = &ctxt->errTab[i];
        if (err->flags & ERROR_IS_DUP) {
            if (err->arg1 != NULL)
                xmlFree((xmlChar *) err->arg1);
            err->arg1 = NULL;
            if (err->arg2 != NULL)
                xmlFree((xmlChar *) err->arg2);
            err->arg2 = NULL;
            err->flags = 0;
        }
    }
    ctxt->errNr = level;
    if (ctxt->errNr <= 0)
        ctxt->err = NULL;
}